

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegRegOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rs;
  uint type;
  uint Rm;
  ARM_AM_ShiftOpc Shift;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  RegNo = fieldFromInstruction_4(in_ESI,0,4);
  uVar2 = fieldFromInstruction_4(in_ESI,5,2);
  uVar3 = fieldFromInstruction_4(in_ESI,8,4);
  DVar4 = DecodeGPRnopcRegisterClass
                    ((MCInst *)CONCAT44(local_4,in_stack_ffffffffffffffd0),RegNo,
                     CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
  if (_Var1) {
    DVar4 = DecodeGPRnopcRegisterClass
                      ((MCInst *)CONCAT44(local_4,in_stack_ffffffffffffffd0),RegNo,
                       CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (_Var1) {
      uVar5 = 2;
      switch(uVar2) {
      case 0:
        uVar5 = 2;
        break;
      case 1:
        uVar5 = 3;
        break;
      case 2:
        uVar5 = 1;
        break;
      case 3:
        uVar5 = 4;
      }
      MCOperand_CreateImm0(in_RDI,(ulong)uVar5);
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSORegRegOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned Rs = fieldFromInstruction_4(Val, 8, 4);

	// Register-register
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rs, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	MCOperand_CreateImm0(Inst, Shift);

	return S;
}